

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int i_2;
  long lVar5;
  int iVar6;
  int i;
  long lVar7;
  uint16_t *puVar8;
  int i_1;
  uint uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  uint32_t out_counters [16];
  __m256i masks [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  undefined8 local_2c0;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar5 = 0;
  lVar7 = 0;
  while (lVar7 != 0x10) {
    *(undefined8 *)(local_500 + lVar5) = 0;
    *(undefined8 *)(local_500 + lVar5 + 8) = 0;
    *(undefined8 *)(local_500 + lVar5 + 0x10) = 0;
    *(undefined8 *)(local_500 + lVar5 + 0x18) = 0;
    lVar7 = lVar7 + 1;
    auVar10 = vpbroadcastw_avx512vl();
    *(undefined1 (*) [32])((long)&local_260 + lVar5) = auVar10;
    lVar5 = lVar5 + 0x20;
  }
  iVar6 = 0;
  local_300 = ZEXT464(0) << 0x40;
  local_2c0 = local_220;
  puVar8 = data;
  for (uVar9 = 0; uVar9 != len >> 0x14; uVar9 = uVar9 + 1) {
    auVar11 = vmovdqa64_avx512vl(local_500);
    auVar10 = vmovdqa64_avx512vl(local_4e0);
    auVar12 = vmovdqa64_avx512vl(local_4c0);
    auVar13 = vmovdqa64_avx512vl(local_4a0);
    auVar14 = vmovdqa64_avx512vl(local_480);
    auVar15 = vmovdqa64_avx512vl(local_460);
    auVar16 = vmovdqa64_avx512vl(local_440);
    auVar17 = vmovdqa64_avx512vl(local_420);
    auVar18 = vmovdqa64_avx512vl(local_400);
    auVar19 = vmovdqa64_avx512vl(local_3e0);
    auVar20 = vmovdqa64_avx512vl(local_3c0);
    auVar21 = vmovdqa64_avx512vl(local_3a0);
    auVar22 = vmovdqa64_avx512vl(local_380);
    auVar23 = vmovdqa64_avx512vl(local_360);
    auVar24 = vmovdqa64_avx512vl(local_340);
    auVar25 = vmovdqa64_avx512vl(local_320);
    lVar5 = 0;
    while ((int)lVar5 != 0x200000) {
      auVar26 = *(undefined1 (*) [32])((long)puVar8 + lVar5);
      lVar5 = lVar5 + 0x20;
      auVar4._8_8_ = uStack_258;
      auVar4._0_8_ = local_260;
      auVar4._16_8_ = uStack_250;
      auVar4._24_8_ = uStack_248;
      auVar27 = vpand_avx2(auVar26,auVar4);
      auVar11 = vpaddw_avx512vl(auVar11,auVar27);
      auVar3._8_8_ = uStack_238;
      auVar3._0_8_ = local_240;
      auVar3._16_8_ = uStack_230;
      auVar3._24_8_ = uStack_228;
      auVar27 = vpand_avx2(auVar26,auVar3);
      auVar27 = vpsrlw_avx2(auVar27,1);
      auVar10 = vpaddw_avx512vl(auVar27,auVar10);
      auVar27._8_8_ = uStack_218;
      auVar27._0_8_ = local_2c0;
      auVar27._16_8_ = uStack_210;
      auVar27._24_8_ = uStack_208;
      auVar27 = vpand_avx2(auVar26,auVar27);
      auVar27 = vpsrlw_avx2(auVar27,2);
      auVar12 = vpaddw_avx512vl(auVar27,auVar12);
      auVar27 = vpand_avx2(local_200,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,3);
      auVar13 = vpaddw_avx512vl(auVar27,auVar13);
      auVar27 = vpand_avx2(local_1e0,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,4);
      auVar14 = vpaddw_avx512vl(auVar27,auVar14);
      auVar27 = vpand_avx2(local_1c0,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,5);
      auVar15 = vpaddw_avx512vl(auVar27,auVar15);
      auVar27 = vpand_avx2(local_1a0,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,6);
      auVar16 = vpaddw_avx512vl(auVar27,auVar16);
      auVar27 = vpand_avx2(local_180,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,7);
      auVar17 = vpaddw_avx512vl(auVar27,auVar17);
      auVar27 = vpand_avx2(local_160,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,8);
      auVar18 = vpaddw_avx512vl(auVar27,auVar18);
      auVar27 = vpand_avx2(local_140,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,9);
      auVar19 = vpaddw_avx512vl(auVar27,auVar19);
      auVar27 = vpand_avx2(local_120,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,10);
      auVar20 = vpaddw_avx512vl(auVar27,auVar20);
      auVar27 = vpand_avx2(local_100,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,0xb);
      auVar21 = vpaddw_avx512vl(auVar27,auVar21);
      auVar27 = vpand_avx2(local_e0,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,0xc);
      auVar22 = vpaddw_avx512vl(auVar27,auVar22);
      auVar27 = vpand_avx2(local_c0,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,0xd);
      auVar23 = vpaddw_avx512vl(auVar27,auVar23);
      auVar27 = vpand_avx2(local_a0,auVar26);
      auVar26 = vpand_avx2(local_80,auVar26);
      auVar27 = vpsrlw_avx2(auVar27,0xe);
      auVar26 = vpsrlw_avx2(auVar26,0xf);
      auVar24 = vpaddw_avx512vl(auVar27,auVar24);
      auVar25 = vpaddw_avx512vl(auVar26,auVar25);
    }
    local_500 = vmovdqa64_avx512vl(auVar11);
    local_4e0 = vmovdqa64_avx512vl(auVar10);
    local_4c0 = vmovdqa64_avx512vl(auVar12);
    local_4a0 = vmovdqa64_avx512vl(auVar13);
    local_480 = vmovdqa64_avx512vl(auVar14);
    local_460 = vmovdqa64_avx512vl(auVar15);
    local_440 = vmovdqa64_avx512vl(auVar16);
    local_420 = vmovdqa64_avx512vl(auVar17);
    local_400 = vmovdqa64_avx512vl(auVar18);
    local_3e0 = vmovdqa64_avx512vl(auVar19);
    local_3c0 = vmovdqa64_avx512vl(auVar20);
    local_3a0 = vmovdqa64_avx512vl(auVar21);
    local_380 = vmovdqa64_avx512vl(auVar22);
    local_360 = vmovdqa64_avx512vl(auVar23);
    local_340 = vmovdqa64_avx512vl(auVar24);
    lVar5 = 0;
    local_320 = vmovdqa64_avx512vl(auVar25);
    for (; lVar5 != 0x40; lVar5 = lVar5 + 4) {
      auVar10 = *(undefined1 (*) [32])(local_500 + lVar5 * 8);
      *(undefined1 (*) [32])(local_500 + lVar5 * 8) = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar24 = vpsrld_avx2(auVar10,0x10);
      auVar10 = vpblendw_avx2(auVar10,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
      auVar10 = vpaddd_avx2(auVar24,auVar10);
      auVar10 = vphaddd_avx2(auVar10,auVar10);
      auVar10 = vphaddd_avx2(auVar10,auVar10);
      auVar2 = vpaddd_avx(auVar10._16_16_,auVar10._0_16_);
      *(int *)(local_300 + lVar5) = *(int *)(local_300 + lVar5) + auVar2._0_4_;
    }
    iVar6 = iVar6 + 0x100000;
    puVar8 = puVar8 + 0x100000;
  }
  for (lVar5 = (long)iVar6; (uint)lVar5 < len; lVar5 = lVar5 + 1) {
    uVar1 = data[lVar5];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      *(uint *)(local_300 + lVar7 * 4) =
           *(int *)(local_300 + lVar7 * 4) + (uint)((uVar1 >> ((uint)lVar7 & 0x1f) & 1) != 0);
    }
  }
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    flags[lVar5] = *(uint32_t *)(local_300 + lVar5 * 4);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i masks[16];
    __m256i counters[16];
    for (int i = 0; i < 16; ++i) {
        masks[i]    = _mm256_set1_epi16(1 << i);
        counters[i] = _mm256_set1_epi16(0);
    }
    uint32_t out_counters[16] = {0};

    const __m256i hi_mask = _mm256_set1_epi32(0xFFFF0000);
    const __m256i lo_mask = _mm256_set1_epi32(0x0000FFFF);
    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_update_cycles = n_cycles / 65536;

#define UPDATE(idx) counters[idx]  = _mm256_add_epi16(counters[idx],  _mm256_srli_epi16(_mm256_and_si256(_mm256_loadu_si256(data_vectors+pos), masks[idx]),  idx))
#define ITERATION  {                               \
    UPDATE(0);  UPDATE(1);  UPDATE(2);  UPDATE(3); \
    UPDATE(4);  UPDATE(5);  UPDATE(6);  UPDATE(7); \
    UPDATE(8);  UPDATE(9);  UPDATE(10); UPDATE(11);\
    UPDATE(12); UPDATE(13); UPDATE(14); UPDATE(15);\
    ++pos;                                         \
}
    uint32_t pos = 0;
    for (int i = 0; i < n_update_cycles; ++i) { // each block of 2^16 values
        for (int k = 0; k < 65536; ++k) // max sum of each 16-bit value in a register
            ITERATION // unrolled

        // Compute vector sum
        for (int k = 0; k < 16; ++k) { // each flag register
            // Accumulator
            // ((16-bit high & 16 high) >> 16) + (16-bit low & 16-low)
            __m256i x = _mm256_add_epi32(
                           _mm256_srli_epi32(_mm256_and_si256(counters[k], hi_mask), 16),
                           _mm256_and_si256(counters[k], lo_mask));
            __m256i t1 = _mm256_hadd_epi32(x,x);
            __m256i t2 = _mm256_hadd_epi32(t1,t1);
            __m128i t4 = _mm_add_epi32(_mm256_castsi256_si128(t2),_mm256_extractf128_si256(t2,1));
            out_counters[k] += _mm_cvtsi128_si32(t4);

            /*
            // Naive counter
            uint16_t* d = (uint16_t*)(&counters[k]);
            for (int j = 0; j < 16; ++j) { // each uint16_t in the register
                out_counters[k] += d[j];
            }
            */

            counters[k] = _mm256_set1_epi16(0);
        }
    }

    // residual
    for (int i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

#undef ITERATION
#undef UPDATE

    return 0;
}